

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O3

void bool_rel(BoolView *x,BoolRelType t,BoolView *y,BoolView *z)

{
  uint uVar1;
  uint uVar2;
  BoolRelType BVar3;
  byte bVar4;
  byte *pbVar5;
  int m;
  uint uVar6;
  BoolRelType BVar7;
  uint uVar8;
  long lVar9;
  BoolRelType BVar10;
  bool bVar11;
  uint local_9c;
  Lit local_8c;
  vec<Lit> local_88;
  ulong local_70;
  uint local_60;
  byte local_5c [12];
  int local_50;
  undefined1 local_4c;
  int local_40;
  undefined1 local_3c;
  
  local_5c[0] = x->s;
  local_60 = x->v;
  local_50 = y->v;
  local_4c = y->s;
  local_40 = z->v;
  local_3c = z->s;
  local_9c = 1;
  BVar7 = 0;
  do {
    uVar8 = 0;
    do {
      uVar1 = local_9c;
      uVar2 = uVar8;
      if (uVar8 != 0) {
        do {
          uVar1 = uVar1 - 1;
          uVar2 = uVar2 - 1 & uVar2;
        } while (uVar2 != 0);
        if (uVar1 == 0) {
          uVar1 = 0;
          do {
            if ((uVar1 & ~uVar8) == 0) {
              uVar2 = 0;
              BVar10 = 0;
              do {
                bVar11 = true;
                uVar6 = 0;
                do {
                  bVar11 = (bool)(bVar11 & (((uVar2 ^ uVar1) >> (uVar6 & 0x1f) & 1) != 0 ||
                                           (uVar8 >> (uVar6 & 0x1f) & 1) == 0));
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 3);
                BVar3 = 1 << ((byte)uVar2 & 0x1f);
                if (!bVar11) {
                  BVar3 = 0;
                }
                BVar10 = BVar10 | BVar3;
                uVar2 = uVar2 + 1;
              } while (uVar2 != 8);
              if (((BVar10 & t) == 0) && ((BVar10 & ~BVar7) != 0)) {
                local_88.sz = 0;
                local_88.cap = 0;
                local_88.data = (Lit *)0x0;
                pbVar5 = local_5c;
                lVar9 = 0;
                do {
                  uVar2 = 1 << ((byte)lVar9 & 0x1f);
                  if ((uVar8 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
                    uVar6 = *(uint *)(pbVar5 + -4);
                    if (local_9c == 1) {
                      bVar11 = (uVar2 & uVar1) != 0;
                      bVar4 = *pbVar5;
                      if ((uint)(bVar4 ^ bVar11) * 2 + -1 != (int)sat.assigns.data[uVar6]) {
                        local_70 = (ulong)uVar6;
                        SAT::cEnqueue(&sat,(Lit)((uint)((bool)bVar4 == bVar11) + uVar6 * 2),
                                      (Reason)0x0);
                        uVar6 = (uint)local_70;
                        if (sat.confl != (Clause *)0x0) {
                          puts("=====UNSATISFIABLE=====");
                          printf("%% Top level failure!\n");
                          exit(0);
                        }
                      }
                    }
                    else {
                      bVar11 = (uVar2 & uVar1) != 0;
                      bVar4 = *pbVar5;
                    }
                    local_8c.x = (uint)((bool)bVar4 == bVar11) + uVar6 * 2;
                    vec<Lit>::push(&local_88,&local_8c);
                  }
                  lVar9 = lVar9 + 1;
                  pbVar5 = pbVar5 + 0x10;
                } while (lVar9 != 3);
                if (1 < local_9c) {
                  SAT::addClause(&sat,&local_88,false);
                }
                if (local_88.data != (Lit *)0x0) {
                  free(local_88.data);
                }
                BVar7 = BVar7 | BVar10;
              }
            }
            uVar1 = uVar1 + 1;
          } while (uVar1 != 8);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 8);
    local_9c = local_9c + 1;
  } while (local_9c != 4);
  return;
}

Assistant:

void bool_rel(BoolView x, BoolRelType t, BoolView y, BoolView z) {
	//	NOT_SUPPORTED;
	const BoolView v[3] = {std::move(x), std::move(y), std::move(z)};
	int u = 0;

	for (int l = 1; l <= 3; l++) {
		for (int i = 0; i < 8; i++) {
			if (bitcount<int>(i) != l) {
				continue;
			}
			for (int j = 0; j < 8; j++) {
				if ((j & ~i) != 0) {
					continue;
				}
				int flags = 0;
				for (int k = 0; k < 8; k++) {
					bool pass = true;
					for (int m = 0; m < 3; m++) {
						if ((i & (1 << m)) == 0) {
							continue;
						}
						if (((k ^ j) & (1 << m)) == 0) {
							pass = false;
						}
					}
					if (pass) {
						flags |= (1 << k);
					}
				}
				if ((t & flags) != 0) {
					continue;
				}
				if ((flags & ~u) == 0) {
					continue;
				}
				vec<Lit> ps;
				for (int m = 0; m < 3; m++) {
					if ((i & (1 << m)) == 0) {
						continue;
					}
					const bool p = ((j >> m) & 1) != 0;
					if (l == 1) {
						if (v[m].setValNotR(p)) {
							if (!v[m].setVal(p)) {
								TL_FAIL();
							}
						}
					}
					ps.push(v[m].getLit(p));
				}
				if (l >= 2) {
					sat.addClause(ps);
				}
				u |= flags;
			}
		}
	}
}